

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausSelectClauses(Clu_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *__ptr;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  iVar1 = p->nClausesMax;
  if (p->vClauses->nSize <= iVar1) {
    __assert_fail("Vec_IntSize(p->vClauses) > p->nClausesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                  ,0x161,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  iVar10 = p->nSimWords;
  uVar8 = (long)iVar10 << 5;
  __ptr = (int *)calloc(1,(long)iVar10 * 0x80 + 4);
  pVVar4 = p->vCosts;
  iVar2 = pVVar4->nSize;
  uVar6 = (ulong)iVar2;
  uVar7 = (uint)uVar8;
  if (0 < (long)uVar6) {
    piVar5 = pVVar4->pArray;
    uVar11 = 0;
    do {
      iVar3 = piVar5[uVar11];
      if ((long)iVar3 != -1) {
        if ((int)uVar7 < iVar3) {
          __assert_fail("Cost < CostMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                        ,0x16a,"int Fra_ClausSelectClauses(Clu_Man_t *)");
        }
        __ptr[iVar3] = __ptr[iVar3] + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  if (*__ptr != 0) {
    __assert_fail("pCostCount[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                  ,0x16d,"int Fra_ClausSelectClauses(Clu_Man_t *)");
  }
  uVar13 = uVar7;
  if (0 < iVar10) {
    iVar10 = 0;
    uVar8 = uVar8 & 0xffffffff;
    do {
      uVar13 = (uint)uVar8;
      if (__ptr[uVar8] < 0) {
        __assert_fail("pCostCount[c] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x172,"int Fra_ClausSelectClauses(Clu_Man_t *)");
      }
      iVar10 = iVar10 + __ptr[uVar8];
      if (iVar1 <= iVar10) goto LAB_00698603;
      uVar8 = (ulong)(uVar13 - 1);
    } while (1 < (int)uVar13);
    uVar13 = 0;
  }
LAB_00698603:
  if (iVar2 < 1) {
    uVar9 = 0;
  }
  else {
    piVar5 = pVVar4->pArray;
    lVar12 = 0;
    uVar9 = 0;
    do {
      if ((piVar5[lVar12] < (int)uVar13) || (p->nClausesMax <= (int)uVar9)) {
        piVar5[lVar12] = -1;
        uVar6 = (ulong)(uint)pVVar4->nSize;
      }
      else {
        uVar9 = uVar9 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar6);
  }
  free(__ptr);
  p->nClauses = uVar9;
  if (p->fVerbose != 0) {
    printf("Selected %d clauses. Cost range: [%d < %d < %d]\n",(ulong)uVar9,1,(ulong)uVar13,
           (ulong)(uVar7 + 1));
  }
  return uVar13;
}

Assistant:

int Fra_ClausSelectClauses( Clu_Man_t * p )
{
    int * pCostCount, nClauCount, Cost, CostMax, i, c;
    assert( Vec_IntSize(p->vClauses) > p->nClausesMax );   
    // count how many implications have each cost
    CostMax = p->nSimWords * 32 + 1;
    pCostCount = ABC_ALLOC( int, CostMax );
    memset( pCostCount, 0, sizeof(int) * CostMax );
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost == -1 )
            continue;
        assert( Cost < CostMax );
        pCostCount[ Cost ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nClauCount = 0;
    for ( c = CostMax - 1; c > 0; c-- )
    {
        assert( pCostCount[c] >= 0 );
        nClauCount += pCostCount[c];
        if ( nClauCount >= p->nClausesMax )
            break;
    }
    // collect implications with the given costs
    nClauCount = 0;
    Vec_IntForEachEntry( p->vCosts, Cost, i )
    {
        if ( Cost >= c && nClauCount < p->nClausesMax )
        {
            nClauCount++;
            continue;
        }
        Vec_IntWriteEntry( p->vCosts, i, -1 );
    }
    ABC_FREE( pCostCount );
    p->nClauses = nClauCount;
if ( p->fVerbose )
printf( "Selected %d clauses. Cost range: [%d < %d < %d]\n", nClauCount, 1, c, CostMax );
    return c;
}